

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O1

iter_result * __thiscall
unodb::detail::
basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::begin(iter_result *__return_storage_ptr__,
       basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
       *this)

{
  ulong uVar1;
  long lVar2;
  undefined1 uVar3;
  ulong uVar4;
  byte bVar5;
  
  if ((this->child_indexes)._M_elems[0].value == 0xff) {
    uVar4 = 0xffffffffffffffff;
    do {
      if (uVar4 == 0xfe) goto LAB_00143887;
      uVar1 = uVar4 + 1;
      lVar2 = uVar4 + 2;
      uVar4 = uVar1;
    } while ((this->child_indexes)._M_elems[lVar2].value == 0xff);
    bVar5 = (char)uVar1 + 1;
    (__return_storage_ptr__->node).tagged_ptr = (ulong)this | 3;
    __return_storage_ptr__->key_byte = bVar5;
    __return_storage_ptr__->child_index = bVar5;
    uVar3 = this->field_0x7;
    *(key_prefix_data *)&__return_storage_ptr__->prefix =
         (key_prefix_data)*(undefined7 *)&this->field_0x0;
    *(undefined1 *)((long)&__return_storage_ptr__->prefix + 7) = uVar3;
    if (0xfe < uVar1) {
LAB_00143887:
      basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>>
      ::begin();
    }
  }
  else {
    (__return_storage_ptr__->node).tagged_ptr = (ulong)this | 3;
    __return_storage_ptr__->key_byte = 0;
    __return_storage_ptr__->child_index = '\0';
    uVar3 = this->field_0x7;
    *(key_prefix_data *)&__return_storage_ptr__->prefix =
         (key_prefix_data)*(undefined7 *)&this->field_0x0;
    *(undefined1 *)((long)&__return_storage_ptr__->prefix + 7) = uVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr typename basic_inode_48::iter_result
  begin() noexcept {
    for (std::uint64_t i = 0; i < 256; i++) {
      if (child_indexes[i] != empty_child) {
        const auto key = static_cast<std::byte>(i);
        const auto child_index = static_cast<std::uint8_t>(i);
        return {node_ptr{this, node_type::I48}, key, child_index,
                this->get_key_prefix().get_snapshot()};
      }
    }
    // because we always have at least 17 keys.
    UNODB_DETAIL_CANNOT_HAPPEN();  // LCOV_EXCL_LINE
  }